

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall google::protobuf::FieldOptions::IsInitialized(FieldOptions *this)

{
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  int i;
  int index;
  
  index = 0;
  do {
    if ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ <= index) {
      bVar1 = internal::ExtensionSet::IsInitialized(&this->_extensions_);
      return bVar1;
    }
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                       (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    iVar2 = (*(pTVar3->super_Message).super_MessageLite._vptr_MessageLite[5])(pTVar3);
    index = index + 1;
  } while ((char)iVar2 != '\0');
  return false;
}

Assistant:

bool FieldOptions::IsInitialized() const {

  for (int i = 0; i < uninterpreted_option_size(); i++) {
    if (!this->uninterpreted_option(i).IsInitialized()) return false;
  }

  if (!_extensions_.IsInitialized()) return false;  return true;
}